

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

void __thiscall Catch::TestCaseTracking::SectionTracker::tryOpen(SectionTracker *this)

{
  uint uVar1;
  int __oflag;
  char *in_RSI;
  SectionTracker *this_local;
  
  uVar1 = (*(this->super_TrackerBase).super_ITracker._vptr_ITracker[2])();
  if ((uVar1 & 1) == 0) {
    TrackerBase::open(&this->super_TrackerBase,in_RSI,__oflag);
  }
  return;
}

Assistant:

void SectionTracker::tryOpen() {
        if( !isComplete() )
            open();
    }